

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O1

IntrusiveList<SynFunctionArgument> ParseFunctionArguments(ParseContext *ctx)

{
  LexemeType LVar1;
  Lexeme *pLVar2;
  IntrusiveList<SynFunctionArgument> IVar3;
  SynFunctionArgument *pSVar4;
  IntrusiveList<SynFunctionArgument> arguments;
  IntrusiveList<SynFunctionArgument> local_28;
  
  local_28.head = (SynFunctionArgument *)0x0;
  local_28.tail = (SynFunctionArgument *)0x0;
  pSVar4 = ParseFunctionArgument(ctx,false,(SynBase *)0x0);
  if (pSVar4 != (SynFunctionArgument *)0x0) {
    IntrusiveList<SynFunctionArgument>::push_back(&local_28,pSVar4);
    pLVar2 = ctx->currentLexeme;
    LVar1 = pLVar2->type;
    while (LVar1 == lex_comma) {
      ctx->currentLexeme = pLVar2 + 1;
      pSVar4 = ParseFunctionArgument
                         (ctx,(bool)((local_28.tail)->super_SynBase).field_0x3a,
                          (local_28.tail)->type);
      if (pSVar4 == (SynFunctionArgument *)0x0) {
        anon_unknown.dwarf_1613e::Report
                  (ctx,ctx->currentLexeme,
                   "ERROR: argument name not found after \',\' in function argument list");
        break;
      }
      IntrusiveList<SynFunctionArgument>::push_back(&local_28,pSVar4);
      pLVar2 = ctx->currentLexeme;
      LVar1 = pLVar2->type;
    }
  }
  IVar3.tail = local_28.tail;
  IVar3.head = local_28.head;
  return IVar3;
}

Assistant:

IntrusiveList<SynFunctionArgument> ParseFunctionArguments(ParseContext &ctx)
{
	IntrusiveList<SynFunctionArgument> arguments;

	if(SynFunctionArgument *argument = ParseFunctionArgument(ctx, false, NULL))
	{
		arguments.push_back(argument);

		while(ctx.Consume(lex_comma))
		{
			argument = ParseFunctionArgument(ctx, arguments.tail->isExplicit, arguments.tail->type);

			if(!argument)
			{
				Report(ctx, ctx.Current(), "ERROR: argument name not found after ',' in function argument list");

				break;
			}

			arguments.push_back(argument);
		}
	}

	return arguments;
}